

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cpp
# Opt level: O1

PSNodesSeq * __thiscall
dg::pta::LLVMPointerGraphBuilder::createGEP(LLVMPointerGraphBuilder *this,Instruction *Inst)

{
  Value *val;
  uint uVar1;
  char cVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  APInt *pAVar6;
  raw_ostream *prVar7;
  uint64_t uVar8;
  PSNode *pPVar9;
  uint uVar10;
  pair<std::__detail::_Node_iterator<std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>,_false,_false>,_bool>
  pVar11;
  StringRef Str;
  StringRef Str_00;
  APInt offset;
  PSNode *op;
  anon_union_8_2_1313ab2f_for_U local_50;
  uint local_48;
  PSNode *local_40;
  anon_union_8_2_1313ab2f_for_U local_38;
  PSNode *local_30;
  
  val = *(Value **)(Inst + -(ulong)(uint)(*(int *)(Inst + 0x14) << 5));
  uVar3 = llvm::Module::getDataLayout();
  lVar5 = llvm::DataLayout::getPointerAlignElem(uVar3);
  uVar3 = *(uint *)(lVar5 + 4);
  pPVar9 = (PSNode *)0x0;
  llvm::APInt::APInt((APInt *)&local_50,uVar3,0,false);
  local_40 = getOperand(this,val);
  if (*(long *)(this + 0xf8) != 0) {
    pAVar6 = (APInt *)llvm::Module::getDataLayout();
    cVar2 = llvm::GetElementPtrInst::accumulateConstantOffset((DataLayout *)Inst,pAVar6);
    uVar1 = local_48;
    if (cVar2 != '\0') {
      if (local_48 < 0x41) {
        if ((anon_union_8_2_1313ab2f_for_U *)local_50.VAL == (anon_union_8_2_1313ab2f_for_U *)0x0) {
          uVar10 = 0x40;
        }
        else {
          lVar5 = 0x3f;
          if ((anon_union_8_2_1313ab2f_for_U *)local_50.VAL != (anon_union_8_2_1313ab2f_for_U *)0x0)
          {
            for (; local_50.VAL >> lVar5 == 0; lVar5 = lVar5 + -1) {
            }
          }
          uVar10 = (uint)lVar5 ^ 0x3f;
        }
        iVar4 = (local_48 - 0x40) + uVar10;
      }
      else {
        iVar4 = llvm::APInt::countLeadingZerosSlowCase();
      }
      if (uVar3 < uVar1 - iVar4) {
        prVar7 = (raw_ostream *)llvm::errs();
        Str.Length = 0x1e;
        Str.Data = "WARN: GEP offset greater than ";
        prVar7 = llvm::raw_ostream::operator<<(prVar7,Str);
        prVar7 = (raw_ostream *)llvm::raw_ostream::operator<<(prVar7,(ulong)uVar3);
        Str_00.Length = 4;
        Str_00.Data = "-bit";
        llvm::raw_ostream::operator<<(prVar7,Str_00);
      }
      else {
        uVar8 = llvm::APInt::getLimitedValue((APInt *)&local_50,*(uint64_t *)(this + 0xf8));
        if ((uVar8 == 0) || (uVar8 < *(ulong *)(this + 0xf8))) {
          local_38.pVal = (uint64_t *)&local_50;
          if (0x40 < local_48) {
            local_38 = local_50;
          }
          local_38 = (anon_union_8_2_1313ab2f_for_U)*local_38.pVal;
          pPVar9 = PointerGraph::create<(dg::pta::PSNodeType)4,dg::pta::PSNode*&,unsigned_long>
                             ((PointerGraph *)this,&local_40,&local_38.VAL);
          goto LAB_0011ee44;
        }
      }
    }
    pPVar9 = (PSNode *)0x0;
  }
LAB_0011ee44:
  if (pPVar9 == (PSNode *)0x0) {
    pPVar9 = PointerGraph::create<(dg::pta::PSNodeType)4,dg::pta::PSNode*&,unsigned_long_const&>
                       ((PointerGraph *)this,&local_40,&Offset::UNKNOWN);
  }
  local_38 = (anon_union_8_2_1313ab2f_for_U)Inst;
  local_30 = pPVar9;
  pVar11 = std::
           _Hashtable<llvm::Value_const*,std::pair<llvm::Value_const*const,dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>,std::allocator<std::pair<llvm::Value_const*const,dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>>,std::__detail::_Select1st,std::equal_to<llvm::Value_const*>,std::hash<llvm::Value_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
           ::_M_emplace<llvm::Value_const*&,dg::pta::PSNode*&>
                     ((_Hashtable<llvm::Value_const*,std::pair<llvm::Value_const*const,dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>,std::allocator<std::pair<llvm::Value_const*const,dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>>,std::__detail::_Select1st,std::equal_to<llvm::Value_const*>,std::hash<llvm::Value_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                       *)(this + 0x188),&local_38,&local_30);
  (local_30->super_SubgraphNode<dg::pta::PSNode>).user_data = (void *)local_38;
  if ((0x40 < local_48) &&
     ((anon_union_8_2_1313ab2f_for_U *)local_50.VAL != (anon_union_8_2_1313ab2f_for_U *)0x0)) {
    operator_delete__(local_50.pVal);
  }
  return (PSNodesSeq *)
         ((long)pVar11.first.
                super__Node_iterator_base<std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>,_false>
                ._M_cur.
                super__Node_iterator_base<std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>,_false>
         + 0x10);
}

Assistant:

LLVMPointerGraphBuilder::PSNodesSeq &
LLVMPointerGraphBuilder::createGEP(const llvm::Instruction *Inst) {
    using namespace llvm;

    const GetElementPtrInst *GEP = cast<GetElementPtrInst>(Inst);
    const Value *ptrOp = GEP->getPointerOperand();
    unsigned bitwidth =
            llvmutils::getPointerBitwidth(&M->getDataLayout(), ptrOp);
    APInt offset(bitwidth, 0);

    PSNode *node = nullptr;
    PSNode *op = getOperand(ptrOp);

    if (*_options.fieldSensitivity > 0 &&
        GEP->accumulateConstantOffset(M->getDataLayout(), offset)) {
        // is offset in given bitwidth?
        if (offset.isIntN(bitwidth)) {
            // is 0 < offset < field_sensitivity ?
            uint64_t off = offset.getLimitedValue(*_options.fieldSensitivity);
            if (off == 0 || off < *_options.fieldSensitivity)
                node = PS.create<PSNodeType::GEP>(op, offset.getZExtValue());
        } else
            errs() << "WARN: GEP offset greater than " << bitwidth << "-bit";
        // fall-through to Offset::UNKNOWN in this case
    }

    // we didn't create the node with concrete offset,
    // in which case we are supposed to create a node
    // with Offset::UNKNOWN
    if (!node)
        node = PS.create<PSNodeType::GEP>(op, Offset::UNKNOWN);

    assert(node);

    return addNode(Inst, node);
}